

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O1

void __thiscall wasm::anon_unknown_0::AsyncifyLocals::~AsyncifyLocals(AsyncifyLocals *this)

{
  AsyncifyBuilder *pAVar1;
  pointer pTVar2;
  
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__AsyncifyLocals_01091698;
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&(this->relevantLiveLocals)._M_t);
  std::
  _Hashtable<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->fakeCallLocals)._M_h);
  pAVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
           ._M_t.
           super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
           .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>.
           _M_head_impl;
  if (pAVar1 != (AsyncifyBuilder *)0x0) {
    operator_delete(pAVar1,0x28);
  }
  (this->builder)._M_t.
  super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
  ._M_t.
  super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
  .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>._M_head_impl =
       (AsyncifyBuilder *)0x0;
  pTVar2 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>_>
           ).
           super_PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
           .
           super_Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
           .stack.flexible.
           super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar2 != (pointer)0x0) {
    operator_delete(pTVar2,(long)*(pointer *)
                                  ((long)&(this->
                                          super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>_>
                                          ).
                                          super_PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                                          .
                                          super_Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                                          .stack.flexible.
                                          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>::Task>_>
                                          ._M_impl + 0x10) - (long)pTVar2);
  }
  Pass::~Pass((Pass *)this);
  operator_delete(this,0x1c8);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }